

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void emit_restart_e(huff_entropy_ptr_conflict entropy,int restart_num)

{
  JOCTET *pJVar1;
  size_t sVar2;
  int local_18;
  int ci;
  int restart_num_local;
  huff_entropy_ptr_conflict entropy_local;
  
  emit_eobrun(entropy);
  if (entropy->gather_statistics == 0) {
    flush_bits_e(entropy);
    pJVar1 = entropy->next_output_byte;
    entropy->next_output_byte = pJVar1 + 1;
    *pJVar1 = 0xff;
    sVar2 = entropy->free_in_buffer - 1;
    entropy->free_in_buffer = sVar2;
    if (sVar2 == 0) {
      dump_buffer_e(entropy);
    }
    pJVar1 = entropy->next_output_byte;
    entropy->next_output_byte = pJVar1 + 1;
    *pJVar1 = (char)restart_num + 0xd0;
    sVar2 = entropy->free_in_buffer - 1;
    entropy->free_in_buffer = sVar2;
    if (sVar2 == 0) {
      dump_buffer_e(entropy);
    }
  }
  if (entropy->cinfo->Ss == 0) {
    for (local_18 = 0; local_18 < entropy->cinfo->comps_in_scan; local_18 = local_18 + 1) {
      (entropy->saved).last_dc_val[local_18] = 0;
    }
  }
  else {
    entropy->EOBRUN = 0;
    entropy->BE = 0;
  }
  return;
}

Assistant:

LOCAL(void)
emit_restart_e (huff_entropy_ptr entropy, int restart_num)
{
  int ci;

  emit_eobrun(entropy);

  if (! entropy->gather_statistics) {
    flush_bits_e(entropy);
    emit_byte_e(entropy, 0xFF);
    emit_byte_e(entropy, JPEG_RST0 + restart_num);
  }

  if (entropy->cinfo->Ss == 0) {
    /* Re-initialize DC predictions to 0 */
    for (ci = 0; ci < entropy->cinfo->comps_in_scan; ci++)
      entropy->saved.last_dc_val[ci] = 0;
  } else {
    /* Re-initialize all AC-related fields to 0 */
    entropy->EOBRUN = 0;
    entropy->BE = 0;
  }
}